

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O2

void eltcalc::OutputQuantiles
               (summarySampleslevelHeader *sh,vector<float,_std::allocator<float>_> *losses_vec,
               FILE *outFile)

{
  _Rb_tree_node_base *p_Var1;
  OASIS_FLOAT loss;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((losses_vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (losses_vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  for (p_Var1 = (_Rb_tree_node_base *)intervals_._24_8_;
      p_Var1 != (_Rb_tree_node_base *)(intervals_ + 8);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    loss = GetQuantileLoss((interval *)&p_Var1[1].field_0x4,losses_vec);
    OutputQuantilesCsv(outFile,sh,(float)p_Var1[1]._M_color,loss);
  }
  return;
}

Assistant:

void OutputQuantiles(const summarySampleslevelHeader& sh,
			     std::vector<OASIS_FLOAT>& losses_vec,
			     FILE * outFile)
	{

		std::sort(losses_vec.begin(), losses_vec.end());

		for (std::map<float, interval>::iterator it = intervals_.begin();
		     it != intervals_.end(); ++it) {

			OASIS_FLOAT loss = GetQuantileLoss(it->second, losses_vec);
			OutputQuantilesCsv(outFile, sh, it->first, loss);

		}

	}